

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseUserDefinedType(Parser *this,string *type_name)

{
  bool bVar1;
  bool bVar2;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
  *this_00;
  string_view text;
  string_view text_00;
  string identifier;
  const_iterator iter;
  string local_60;
  iterator local_40;
  
  type_name->_M_string_length = 0;
  *(type_name->_M_dataplus)._M_p = '\0';
  this_00 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
             *)anon_unknown_0::GetTypeNameTable();
  local_40 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
             ::find<std::__cxx11::string>(this_00,&(this->input_->current_).text);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
              *)this_00);
  local_60._M_dataplus._M_p = (pointer)0x0;
  bVar1 = absl::lts_20250127::container_internal::operator==(&local_40,(iterator *)&local_60);
  if (bVar1) {
    text._M_str = ".";
    text._M_len = 1;
    bVar1 = TryConsume(this,text);
    if (bVar1) {
      std::__cxx11::string::append((char *)type_name);
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    bVar1 = ConsumeIdentifier(this,&local_60,(ErrorMaker)ZEXT816(0x3d82c3));
    if (bVar1) {
      std::__cxx11::string::_M_append((char *)type_name,(ulong)local_60._M_dataplus._M_p);
      while( true ) {
        text_00._M_str = ".";
        text_00._M_len = 1;
        bVar1 = TryConsume(this,text_00);
        if (!bVar1) break;
        std::__cxx11::string::append((char *)type_name);
        bVar2 = ConsumeIdentifier(this,&local_60,(ErrorMaker)ZEXT816(0x3d7b3f));
        if (!bVar2) break;
        std::__cxx11::string::_M_append((char *)type_name,(ulong)local_60._M_dataplus._M_p);
      }
      bVar1 = !bVar1;
    }
    else {
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    RecordError(this,(ErrorMaker)ZEXT816(0x3d82ac));
    std::__cxx11::string::_M_assign((string *)type_name);
    io::Tokenizer::Next(this->input_);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Parser::ParseUserDefinedType(std::string* type_name) {
  type_name->clear();

  const auto& type_names_table = GetTypeNameTable();
  auto iter = type_names_table.find(input_->current().text);
  if (iter != type_names_table.end()) {
    // Note:  The only place enum types are allowed is for field types, but
    //   if we are parsing a field type then we would not get here because
    //   primitives are allowed there as well.  So this error message doesn't
    //   need to account for enums.
    RecordError("Expected message type.");

    // Pretend to accept this type so that we can go on parsing.
    *type_name = input_->current().text;
    input_->Next();
    return true;
  }

  // A leading "." means the name is fully-qualified.
  if (TryConsume(".")) type_name->append(".");

  // Consume the first part of the name.
  std::string identifier;
  DO(ConsumeIdentifier(&identifier, "Expected type name."));
  type_name->append(identifier);

  // Consume more parts.
  while (TryConsume(".")) {
    type_name->append(".");
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    type_name->append(identifier);
  }

  return true;
}